

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<NULLCRef,_false,_false>::grow_no_destroy
          (FastVector<NULLCRef,_false,_false> *this,uint newSize)

{
  uint uVar1;
  NULLCRef *dst;
  uint uVar2;
  
  uVar2 = (this->max >> 1) + this->max;
  uVar1 = newSize + 0x20;
  if (newSize < uVar2) {
    uVar1 = uVar2;
  }
  dst = (NULLCRef *)(*(code *)NULLC::alloc)(uVar1 * 0xc + 4);
  if (dst != (NULLCRef *)0x0) {
    if (this->data != (NULLCRef *)0x0) {
      NULLC::copyMemory(dst,this->data,(ulong)this->max * 0xc);
    }
    this->data = dst;
    this->max = uVar1;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<NULLCRef>::grow_no_destroy(unsigned int) [T = NULLCRef, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}